

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_corpus.c
# Opt level: O1

int enum_corpus(lexicon_t *lex,model_def_t *mdef,uint32 *cnt,cnt_fn_t cnt_fn)

{
  acmod_set_t *acmod_set;
  uint32 n_phone_00;
  int iVar1;
  uint n_word;
  char **ptr;
  char *pcVar2;
  char *fmt;
  long ln;
  ulong uVar3;
  acmod_id_t *phone;
  char *trans;
  uint16 *seg;
  char *btw_mark;
  uint32 n_phone;
  int32 n_frame;
  char *local_78;
  uint16 *local_70;
  char *local_68;
  uint32 local_60;
  uint32 local_5c;
  cnt_fn_t local_58;
  uint32 local_4c;
  model_def_t *local_48;
  uint32 *local_40;
  uint16 *local_38;
  
  ptr = (char **)0x0;
  local_78 = (char *)0x0;
  local_70 = (uint16 *)0x0;
  local_68 = (char *)0x0;
  local_58 = cnt_fn;
  local_48 = mdef;
  local_40 = cnt;
  iVar1 = corpus_next_utt();
  phone = (acmod_id_t *)0x0;
  if (iVar1 != 0) {
    uVar3 = 1;
    phone = (acmod_id_t *)0x0;
    ptr = (char **)0x0;
    do {
      if (local_78 != (char *)0x0) {
        free(local_78);
        local_78 = (char *)0x0;
      }
      if (local_70 != (uint16 *)0x0) {
        free(local_70);
        local_70 = (uint16 *)0x0;
      }
      if (ptr != (char **)0x0) {
        ckd_free(ptr);
      }
      if (phone != (acmod_id_t *)0x0) {
        ckd_free(phone);
      }
      if (local_68 != (char *)0x0) {
        ckd_free(local_68);
        local_68 = (char *)0x0;
      }
      if ((int)(uVar3 / 1000) * -1000 + 1 + (int)uVar3 == 1) {
        enum_corpus_cold_1();
      }
      iVar1 = corpus_get_sent(&local_78);
      if (iVar1 != 0) {
        pcVar2 = corpus_utt_brief_name();
        fmt = "Unable to read word transcript for %s\n";
        ln = 0x6a;
LAB_00102bdb:
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/enum_corpus.c"
                ,ln,fmt,pcVar2);
        exit(1);
      }
      if ((local_58 != phone_cnt) &&
         (iVar1 = corpus_get_seg(&local_70,(int32 *)&local_5c), iVar1 != 0)) {
        pcVar2 = corpus_utt_brief_name();
        fmt = "Unable to read Viterbi state segmentation for %s\n";
        ln = 0x70;
        goto LAB_00102bdb;
      }
      n_word = str2words(local_78,(char **)0x0,0);
      ptr = (char **)__ckd_calloc__((ulong)n_word,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/enum_corpus.c"
                                    ,0x75);
      str2words(local_78,ptr,n_word);
      phone = mk_phone_list(&local_68,&local_60,ptr,n_word,lex);
      n_phone_00 = local_60;
      if (phone == (acmod_id_t *)0x0) {
        pcVar2 = corpus_utt();
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/enum_corpus.c"
                ,0x7a,"Unable to produce phone sequence; skipping utt %s\n",pcVar2);
        phone = (acmod_id_t *)0x0;
      }
      else {
        if (local_58 != phone_cnt) {
          acmod_set = local_48->acmod_set;
          local_38 = local_70;
          local_4c = local_5c;
          pcVar2 = corpus_utt();
          iVar1 = ck_seg(acmod_set,phone,n_phone_00,local_38,local_4c,pcVar2);
          if (iVar1 != 0) goto LAB_00102b19;
        }
        (*local_58)(local_40,local_48,local_70,local_5c,phone,local_68,local_60);
      }
LAB_00102b19:
      iVar1 = corpus_next_utt();
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (iVar1 != 0);
  }
  if (local_78 != (char *)0x0) {
    free(local_78);
    local_78 = (char *)0x0;
  }
  if (local_70 != (uint16 *)0x0) {
    free(local_70);
    local_70 = (uint16 *)0x0;
  }
  if (ptr != (char **)0x0) {
    ckd_free(ptr);
  }
  if (phone != (acmod_id_t *)0x0) {
    ckd_free(phone);
  }
  if (local_68 != (char *)0x0) {
    ckd_free(local_68);
  }
  return 0;
}

Assistant:

int
enum_corpus(lexicon_t *lex,
	    model_def_t *mdef,
	    uint32 *cnt,
	    cnt_fn_t cnt_fn)
{
    uint32 tick_cnt = 0;
    char *trans = NULL;
    uint16 *seg = NULL;
    int32 n_frame;
    char **word = NULL;
    uint32 n_word;
    acmod_id_t *phone = NULL;
    uint32 n_phone;
    char *btw_mark = NULL;

    while (corpus_next_utt()) {
	if (trans) {
	    free(trans);
	    trans = NULL;
	}
	if (seg) {
	    free(seg);
	    seg = NULL;
	}
	if (word) {
	    ckd_free(word);
	    word = NULL;
	}
	if (phone) {
	    ckd_free(phone);
	    phone = NULL;
	}
	if (btw_mark) {
	    ckd_free(btw_mark);
	    btw_mark = NULL;
	}
	
	if ((++tick_cnt % 1000) == 0) {
	    fprintf(stderr, "[%u] ", tick_cnt);
	    fflush(stderr);
	}

	if (corpus_get_sent(&trans) != S3_SUCCESS) {
	    E_FATAL("Unable to read word transcript for %s\n", corpus_utt_brief_name());
	}

        if (cnt_fn != phone_cnt){
	    if (corpus_get_seg(&seg, &n_frame) != S3_SUCCESS) {
	        E_FATAL("Unable to read Viterbi state segmentation for %s\n",
		    corpus_utt_brief_name());
            }
	}
	    
	n_word = str2words(trans, NULL, 0);
	word = ckd_calloc(n_word, sizeof(char*));
	str2words(trans, word, n_word);

	phone = mk_phone_list(&btw_mark, &n_phone, word, n_word, lex);
	if (phone == NULL) {
	    E_WARN("Unable to produce phone sequence; skipping utt %s\n", corpus_utt());
	    continue;
	}

        if (cnt_fn != phone_cnt){
	    /* check to see whether the word transcript and dictionary entries
	       agree with the state segmentation */
	    if (ck_seg(mdef->acmod_set, phone, n_phone, seg, n_frame, corpus_utt()) != S3_SUCCESS) {
	        continue;
            }
	}

	(*cnt_fn)(cnt,				/* observation counts */
		  mdef,				/* model definitions */
		  seg, n_frame,			/* Viterbi state segmentation */
		  phone, btw_mark, n_phone);	/* list of phones */
    }

    /* free the per utterance data structures from the last utt */
    if (trans) {
	free(trans);
	trans = NULL;
    }
    if (seg) {
	free(seg);
	seg = NULL;
    }
    if (word) {
	ckd_free(word);
	word = NULL;
    }
    if (phone) {
	ckd_free(phone);
	phone = NULL;
    }
    if (btw_mark) {
	ckd_free(btw_mark);
	btw_mark = NULL;
    }
    
    return S3_SUCCESS;
}